

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void computeLimitRegisters(Parse *pParse,Select *p,int iBreak)

{
  short sVar1;
  LogEst LVar2;
  int iVar3;
  int local_34;
  int local_30;
  int n;
  int iOffset;
  int iLimit;
  Vdbe *v;
  Select *pSStack_18;
  int iBreak_local;
  Select *p_local;
  Parse *pParse_local;
  
  _iOffset = (Vdbe *)0x0;
  n = 0;
  if ((p->iLimit == 0) &&
     (v._4_4_ = iBreak, pSStack_18 = p, p_local = (Select *)pParse, sqlite3ExprCacheClear(pParse),
     pSStack_18->pLimit != (Expr *)0x0)) {
    n = *(int *)&p_local->pHaving + 1;
    *(int *)&p_local->pHaving = n;
    pSStack_18->iLimit = n;
    _iOffset = sqlite3GetVdbe((Parse *)p_local);
    iVar3 = sqlite3ExprIsInteger(pSStack_18->pLimit,&local_34);
    if (iVar3 == 0) {
      sqlite3ExprCode((Parse *)p_local,pSStack_18->pLimit,n);
      sqlite3VdbeAddOp1(_iOffset,0x11,n);
      sqlite3VdbeAddOp2(_iOffset,0x16,n,v._4_4_);
    }
    else {
      sqlite3VdbeAddOp2(_iOffset,0x38,local_34,n);
      if (local_34 == 0) {
        sqlite3VdbeGoto(_iOffset,v._4_4_);
      }
      else if ((-1 < local_34) &&
              (sVar1 = pSStack_18->nSelectRow, LVar2 = sqlite3LogEst((long)local_34), LVar2 < sVar1)
              ) {
        LVar2 = sqlite3LogEst((long)local_34);
        pSStack_18->nSelectRow = LVar2;
        pSStack_18->selFlags = pSStack_18->selFlags | 0x4000;
      }
    }
    if (pSStack_18->pOffset != (Expr *)0x0) {
      local_30 = *(int *)&p_local->pHaving + 1;
      *(int *)&p_local->pHaving = local_30;
      pSStack_18->iOffset = local_30;
      *(int *)&p_local->pHaving = *(int *)&p_local->pHaving + 1;
      sqlite3ExprCode((Parse *)p_local,pSStack_18->pOffset,local_30);
      sqlite3VdbeAddOp1(_iOffset,0x11,local_30);
      sqlite3VdbeAddOp3(_iOffset,0x93,n,local_30 + 1,local_30);
    }
  }
  return;
}

Assistant:

static void computeLimitRegisters(Parse *pParse, Select *p, int iBreak){
  Vdbe *v = 0;
  int iLimit = 0;
  int iOffset;
  int n;
  if( p->iLimit ) return;

  /* 
  ** "LIMIT -1" always shows all rows.  There is some
  ** controversy about what the correct behavior should be.
  ** The current implementation interprets "LIMIT 0" to mean
  ** no rows.
  */
  sqlite3ExprCacheClear(pParse);
  assert( p->pOffset==0 || p->pLimit!=0 );
  if( p->pLimit ){
    p->iLimit = iLimit = ++pParse->nMem;
    v = sqlite3GetVdbe(pParse);
    assert( v!=0 );
    if( sqlite3ExprIsInteger(p->pLimit, &n) ){
      sqlite3VdbeAddOp2(v, OP_Integer, n, iLimit);
      VdbeComment((v, "LIMIT counter"));
      if( n==0 ){
        sqlite3VdbeGoto(v, iBreak);
      }else if( n>=0 && p->nSelectRow>sqlite3LogEst((u64)n) ){
        p->nSelectRow = sqlite3LogEst((u64)n);
        p->selFlags |= SF_FixedLimit;
      }
    }else{
      sqlite3ExprCode(pParse, p->pLimit, iLimit);
      sqlite3VdbeAddOp1(v, OP_MustBeInt, iLimit); VdbeCoverage(v);
      VdbeComment((v, "LIMIT counter"));
      sqlite3VdbeAddOp2(v, OP_IfNot, iLimit, iBreak); VdbeCoverage(v);
    }
    if( p->pOffset ){
      p->iOffset = iOffset = ++pParse->nMem;
      pParse->nMem++;   /* Allocate an extra register for limit+offset */
      sqlite3ExprCode(pParse, p->pOffset, iOffset);
      sqlite3VdbeAddOp1(v, OP_MustBeInt, iOffset); VdbeCoverage(v);
      VdbeComment((v, "OFFSET counter"));
      sqlite3VdbeAddOp3(v, OP_OffsetLimit, iLimit, iOffset+1, iOffset);
      VdbeComment((v, "LIMIT+OFFSET"));
    }
  }
}